

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.cpp
# Opt level: O2

void Ptex::v2_2::(anonymous_namespace)::ApplyS<Ptex::v2_2::PtexHalf,4>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int nTxChan)

{
  byte bVar1;
  int iVar2;
  float *pfVar3;
  long lVar4;
  float *pfVar5;
  PtexHalf *val;
  VecMult<Ptex::v2_2::PtexHalf,_4> local_71;
  long local_70;
  PtexSeparableKernel *local_68;
  float *local_60;
  PtexHalf *local_58;
  float *local_50;
  float local_48 [6];
  
  bVar1 = (k->res).ulog2;
  iVar2 = k->uw;
  pfVar3 = k->kv;
  val = (PtexHalf *)((long)data + (long)(((k->v << (bVar1 & 0x1f)) + k->u) * nTxChan) * 2);
  local_70 = (long)(nTxChan << (bVar1 & 0x1f));
  local_58 = val + k->vw * local_70;
  local_70 = local_70 * 2;
  local_68 = k;
  local_60 = result;
  for (; val != local_58; val = (PtexHalf *)((long)&val->bits + local_70)) {
    pfVar5 = local_68->ku;
    local_50 = pfVar3;
    PtexUtils::VecMult<Ptex::v2_2::PtexHalf,_4>::operator()(&local_71,local_48,val,*pfVar5);
    for (lVar4 = (long)nTxChan * 2; pfVar5 = pfVar5 + 1, (long)(iVar2 * nTxChan) * 2 != lVar4;
        lVar4 = lVar4 + (long)nTxChan * 2) {
      PtexUtils::VecAccum<Ptex::v2_2::PtexHalf,_4>::operator()
                ((VecAccum<Ptex::v2_2::PtexHalf,_4> *)&local_71,local_48,
                 (PtexHalf *)((long)&val->bits + lVar4),*pfVar5);
    }
    pfVar3 = local_50 + 1;
    PtexUtils::VecAccum<float,_4>::operator()
              ((VecAccum<float,_4> *)&local_71,local_60,local_48,*local_50);
  }
  return;
}

Assistant:

void ApplyS(PtexSeparableKernel& k, float* result, void* data, int /*nChan*/, int nTxChan)
    {
        float* rowResult = (float*) alloca(nChan*sizeof(float));
        int rowlen = k.res.u() * nTxChan;
        int datalen = k.uw * nTxChan;
        int rowskip = rowlen - datalen;
        float* kvp = k.kv;
        T* p = static_cast<T*>(data) + (k.v * k.res.u() + k.u) * nTxChan;
        T* pEnd = p + k.vw * rowlen;
        while (p != pEnd)
        {
            float* kup = k.ku;
            T* pRowEnd = p + datalen;
            // just mult and copy first element
            PtexUtils::VecMult<T,nChan>()(rowResult, p, *kup++);
            p += nTxChan;
            // accumulate remaining elements
            while (p != pRowEnd) {
                // rowResult[i] = p[i] * ku[u] for i in {0..n-1}
                PtexUtils::VecAccum<T,nChan>()(rowResult, p, *kup++);
                p += nTxChan;
            }
            // result[i] += rowResult[i] * kv[v] for i in {0..n-1}
            PtexUtils::VecAccum<float,nChan>()(result, rowResult, *kvp++);
            p += rowskip;
        }
    }